

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_textedit.h
# Opt level: O3

int ImGuiStb::stb_textedit_paste
              (ImGuiTextEditState *str,STB_TexteditState *state,ImWchar *ctext,int len)

{
  ushort uVar1;
  int iVar2;
  bool bVar3;
  int n;
  uint uVar4;
  ImWchar *pIVar5;
  int iVar6;
  int iVar7;
  
  iVar2 = str->CurLenW;
  iVar6 = state->select_start;
  iVar7 = state->select_end;
  if (iVar6 != iVar7) {
    if (iVar2 < iVar6) {
      state->select_start = iVar2;
      iVar6 = iVar2;
    }
    if (iVar2 < iVar7) {
      state->select_end = iVar2;
      iVar7 = iVar2;
    }
    if (iVar6 == iVar7) {
      state->cursor = iVar6;
    }
  }
  if (iVar2 < state->cursor) {
    state->cursor = iVar2;
  }
  stb_textedit_delete_selection(str,state);
  bVar3 = STB_TEXTEDIT_INSERTCHARS(str,state->cursor,ctext,len);
  if (bVar3) {
    pIVar5 = stb_text_createundo(&state->undostate,state->cursor,0,len);
    uVar4 = (uint)pIVar5;
    state->cursor = state->cursor + len;
    state->has_preferred_x = '\0';
  }
  else {
    uVar1 = (state->undostate).undo_point;
    uVar4 = (uint)uVar1;
    if (uVar1 != 0) {
      uVar4 = uVar1 - 1;
      (state->undostate).undo_point = (short)uVar4;
    }
  }
  return uVar4;
}

Assistant:

static int stb_textedit_paste(STB_TEXTEDIT_STRING *str, STB_TexteditState *state, STB_TEXTEDIT_CHARTYPE const *ctext, int len)
{
   STB_TEXTEDIT_CHARTYPE *text = (STB_TEXTEDIT_CHARTYPE *) ctext;
   // if there's a selection, the paste should delete it
   stb_textedit_clamp(str, state);
   stb_textedit_delete_selection(str,state);
   // try to insert the characters
   if (STB_TEXTEDIT_INSERTCHARS(str, state->cursor, text, len)) {
      stb_text_makeundo_insert(state, state->cursor, len);
      state->cursor += len;
      state->has_preferred_x = 0;
      return 1;
   }
   // remove the undo since we didn't actually insert the characters
   if (state->undostate.undo_point)
      --state->undostate.undo_point;
   return 0;
}